

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t *
roaring_bitmap_lazy_or(roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  byte bVar1;
  int iVar2;
  uint8_t uVar3;
  byte bVar4;
  _Bool _Var5;
  uint uVar6;
  roaring_array_t *ra;
  roaring_bitmap_t *prVar7;
  container_t *pcVar8;
  array_container_t *paVar9;
  array_container_t *paVar10;
  uint end_index;
  ulong uVar11;
  uint uVar12;
  undefined7 in_register_00000011;
  int iVar13;
  array_container_t *paVar14;
  roaring_array_t *sa;
  array_container_t *src_2;
  uint16_t uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  uint8_t result_type;
  uint8_t type1;
  uint8_t type2;
  uint8_t local_9d;
  byte local_9c;
  byte local_9b;
  uint16_t local_9a;
  array_container_t *local_98;
  ulong local_90;
  ulong local_88;
  ushort local_7a;
  ulong local_78;
  roaring_array_t *local_70;
  roaring_array_t *local_68;
  undefined4 local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  local_9d = '\0';
  uVar12 = (x1->high_low_container).size;
  local_78 = (ulong)uVar12;
  prVar7 = x2;
  if (uVar12 != 0) {
    uVar6 = (x2->high_low_container).size;
    prVar7 = x1;
    if (uVar6 != 0) {
      local_5c = (undefined4)CONCAT71(in_register_00000011,bitsetconversion);
      local_70 = &x2->high_low_container;
      ra = &roaring_bitmap_create_with_capacity(uVar6 + uVar12)->high_low_container;
      if ((((x1->high_low_container).flags & 1) == 0) || ((local_70->flags & 1) == 0)) {
        ra->flags = ra->flags & 0xfe;
      }
      else {
        ra->flags = ra->flags | 1;
      }
      local_9a = *(x1->high_low_container).keys;
      uVar15 = *local_70->keys;
      local_50 = (ulong)-uVar6;
      local_90 = 0;
      uVar16 = 0;
      local_68 = &x1->high_low_container;
      local_58 = (ulong)uVar6;
LAB_001150d3:
      do {
        local_88 = uVar16 & 0xffffffff;
        iVar13 = (int)local_50 + (int)uVar16;
        local_38 = (long)(int)uVar16;
        local_40 = local_38 * 8;
        lVar18 = 0;
        local_48 = uVar16;
        while( true ) {
          sa = local_68;
          uVar16 = local_88 + lVar18;
          iVar17 = (int)lVar18;
          uVar12 = (uint)local_90;
          if (local_9a == uVar15) break;
          if (local_9a < uVar15) {
            local_9c = local_68->typecodes[local_90 & 0xffff];
            pcVar8 = get_copy_of_container
                               (local_68->containers[local_90 & 0xffff],&local_9c,
                                (_Bool)(local_68->flags & 1));
            bVar1 = local_9c;
            if ((sa->flags & 1) != 0) {
              if (sa->size <= (int)uVar12) goto LAB_00115734;
              sa->containers[(int)uVar12] = pcVar8;
              sa->typecodes[(int)uVar12] = local_9c;
            }
            extend_array(ra,1);
            iVar13 = ra->size;
            ra->keys[iVar13] = local_9a;
            ra->containers[iVar13] = pcVar8;
            ra->typecodes[iVar13] = bVar1;
            ra->size = ra->size + 1;
            uVar12 = (int)local_90 + 1;
            if (uVar12 != (uint)local_78) {
              local_9a = sa->keys[(ulong)uVar12 & 0xffff];
            }
            if (uVar12 != (uint)local_78) {
              uVar16 = (ulong)(uint)((int)local_88 + iVar17);
              local_90 = (ulong)uVar12;
              goto LAB_001150d3;
            }
            uVar6 = iVar17 + (int)local_88;
            goto LAB_001156d2;
          }
          uVar11 = uVar16 & 0xffff;
          local_9b = local_70->typecodes[uVar11];
          pcVar8 = get_copy_of_container
                             (local_70->containers[uVar11],&local_9b,(_Bool)(local_70->flags & 1));
          bVar1 = local_9b;
          if ((local_70->flags & 1) != 0) {
            if (((roaring_array_t *)&local_70->size)->size <= (int)uVar16) {
LAB_00115734:
              __assert_fail("i < ra->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1a3a,
                            "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                           );
            }
            *(container_t **)((long)local_70->containers + lVar18 * 8 + local_40) = pcVar8;
            local_70->typecodes[lVar18 + local_38] = local_9b;
          }
          extend_array(ra,1);
          iVar2 = ra->size;
          ra->keys[iVar2] = uVar15;
          ra->containers[iVar2] = pcVar8;
          ra->typecodes[iVar2] = bVar1;
          ra->size = ra->size + 1;
          if (iVar13 + iVar17 != -1) {
            uVar15 = local_70->keys[(ushort)((short)local_88 + (short)lVar18 + 1)];
          }
          lVar18 = lVar18 + 1;
          if ((int)lVar18 + iVar13 == 0) {
            uVar6 = (int)local_48 + (int)lVar18;
            uVar12 = (uint)local_90;
            sa = local_68;
            goto LAB_001156d2;
          }
        }
        local_9c = local_68->typecodes[uVar12 & 0xffff];
        paVar10 = (array_container_t *)local_68->containers[uVar12 & 0xffff];
        uVar12 = (int)local_88 + iVar17 & 0xffff;
        bVar1 = local_70->typecodes[uVar12];
        src_2 = (array_container_t *)local_70->containers[uVar12];
        local_9b = bVar1;
        local_7a = uVar15;
        if ((char)local_5c != '\0') {
          bVar4 = local_9c;
          if (local_9c == 4) {
            bVar4 = *(byte *)&paVar10->array;
          }
          if (bVar4 == 1) goto LAB_0011525a;
          bVar4 = bVar1;
          if (bVar1 == 4) {
            bVar4 = *(byte *)&src_2->array;
          }
          if (bVar4 == 1) goto LAB_0011525a;
          if (local_9c == 4) {
            local_9c = *(byte *)&paVar10->array;
            if (local_9c == 4) {
              __assert_fail("*type != SHARED_CONTAINER_TYPE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1070,
                            "container_t *container_mutable_unwrap_shared(container_t *, uint8_t *)"
                           );
            }
            paVar10 = *(array_container_t **)paVar10;
          }
          switch(local_9c) {
          case 1:
            break;
          case 2:
            paVar10 = (array_container_t *)bitset_container_from_array(paVar10);
            break;
          case 3:
            paVar10 = (array_container_t *)bitset_container_from_run((run_container_t *)paVar10);
            break;
          case 4:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x10ae,"bitset_container_t *container_to_bitset(container_t *, uint8_t)")
            ;
          default:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x10b0,"bitset_container_t *container_to_bitset(container_t *, uint8_t)")
            ;
          }
          local_9c = 1;
          paVar9 = (array_container_t *)container_lazy_ior(paVar10,'\x01',src_2,bVar1,&local_9d);
          if (paVar9 != paVar10) {
            container_free(paVar10,local_9c);
          }
          goto LAB_001155b3;
        }
LAB_0011525a:
        bVar4 = local_9c;
        if (local_9c == 4) {
          bVar4 = *(byte *)&paVar10->array;
          if (bVar4 == 4) goto LAB_00115753;
          paVar10 = *(array_container_t **)paVar10;
        }
        if (bVar1 == 4) {
          bVar1 = *(byte *)&src_2->array;
          if (bVar1 == 4) {
LAB_00115753:
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1062,
                          "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                         );
          }
          src_2 = *(array_container_t **)src_2;
        }
        local_98 = (array_container_t *)0x0;
        switch((uint)bVar1 + (uint)bVar4 * 4) {
        case 5:
          paVar9 = (array_container_t *)bitset_container_create();
          local_98 = paVar9;
          bitset_container_or_nocard
                    ((bitset_container_t *)paVar10,(bitset_container_t *)src_2,
                     (bitset_container_t *)paVar9);
          goto LAB_0011550f;
        case 6:
          paVar9 = (array_container_t *)bitset_container_create();
          paVar14 = paVar10;
          goto LAB_001154d0;
        case 7:
          if (((src_2->cardinality != 1) || (*src_2->array != 0)) || (src_2->array[1] != 0xffff)) {
            paVar9 = (array_container_t *)bitset_container_create();
            paVar14 = paVar10;
            goto LAB_00115507;
          }
          paVar9 = (array_container_t *)malloc(0x10);
          if (paVar9 == (array_container_t *)0x0) {
            paVar9 = (array_container_t *)0x0;
          }
          else {
            paVar9->cardinality = 0;
            paVar9->capacity = 0;
            paVar9->array = (uint16_t *)0x0;
          }
LAB_001156b0:
          local_9d = '\x03';
          local_98 = paVar9;
          run_container_copy((run_container_t *)src_2,(run_container_t *)paVar9);
          break;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x14e3,
                        "container_t *container_lazy_or(const container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                       );
        case 9:
          paVar9 = (array_container_t *)bitset_container_create();
          paVar14 = src_2;
          src_2 = paVar10;
LAB_001154d0:
          local_98 = paVar9;
          array_bitset_container_lazy_union
                    (src_2,(bitset_container_t *)paVar14,(bitset_container_t *)paVar9);
          goto LAB_0011550f;
        case 10:
          _Var5 = array_array_container_lazy_union(paVar10,src_2,&local_98);
          local_9d = '\x02' - _Var5;
          paVar9 = local_98;
          break;
        case 0xb:
          paVar9 = (array_container_t *)malloc(0x10);
          paVar14 = src_2;
          if (paVar9 == (array_container_t *)0x0) {
            paVar9 = (array_container_t *)0x0;
          }
          else {
            paVar9->cardinality = 0;
            paVar9->capacity = 0;
            paVar9->array = (uint16_t *)0x0;
          }
          goto LAB_001155a6;
        case 0xd:
          if (((paVar10->cardinality == 1) && (*paVar10->array == 0)) &&
             (paVar10->array[1] == 0xffff)) {
            paVar9 = (array_container_t *)malloc(0x10);
            if (paVar9 == (array_container_t *)0x0) {
              paVar9 = (array_container_t *)0x0;
              src_2 = paVar10;
            }
            else {
              paVar9->cardinality = 0;
              paVar9->capacity = 0;
              paVar9->array = (uint16_t *)0x0;
              src_2 = paVar10;
            }
            goto LAB_001156b0;
          }
          paVar9 = (array_container_t *)bitset_container_create();
          paVar14 = src_2;
          src_2 = paVar10;
LAB_00115507:
          local_98 = paVar9;
          run_bitset_container_lazy_union
                    ((run_container_t *)src_2,(bitset_container_t *)paVar14,
                     (bitset_container_t *)paVar9);
LAB_0011550f:
          local_9d = '\x01';
          break;
        case 0xe:
          paVar9 = (array_container_t *)malloc(0x10);
          paVar14 = paVar10;
          paVar10 = src_2;
          if (paVar9 == (array_container_t *)0x0) {
            paVar9 = (array_container_t *)0x0;
          }
          else {
            paVar9->cardinality = 0;
            paVar9->capacity = 0;
            paVar9->array = (uint16_t *)0x0;
          }
LAB_001155a6:
          local_98 = paVar9;
          array_run_container_union(paVar10,(run_container_t *)paVar14,(run_container_t *)paVar9);
          local_9d = '\x03';
          break;
        case 0xf:
          paVar9 = (array_container_t *)malloc(0x10);
          if (paVar9 == (array_container_t *)0x0) {
            paVar9 = (array_container_t *)0x0;
          }
          else {
            paVar9->cardinality = 0;
            paVar9->capacity = 0;
            paVar9->array = (uint16_t *)0x0;
          }
          local_98 = paVar9;
          run_container_union((run_container_t *)paVar10,(run_container_t *)src_2,
                              (run_container_t *)paVar9);
          local_9d = '\x03';
          local_98 = (array_container_t *)
                     convert_run_to_efficient_container((run_container_t *)paVar9,&local_9d);
          paVar9 = local_98;
        }
LAB_001155b3:
        uVar3 = local_9d;
        extend_array(ra,1);
        iVar13 = ra->size;
        ra->keys[iVar13] = local_9a;
        ra->containers[iVar13] = paVar9;
        ra->typecodes[iVar13] = uVar3;
        ra->size = ra->size + 1;
        uVar12 = (int)local_90 + 1;
        uVar16 = local_88 + lVar18 + 1;
        if ((int)local_88 + (int)local_50 + iVar17 == -1 || uVar12 == (uint)local_78) {
          uVar6 = iVar17 + (int)local_88 + 1;
LAB_001156d2:
          if (uVar12 == (uint)local_78) {
            bVar1 = local_70->flags;
            sa = local_70;
            end_index = (uint)local_58;
            uVar12 = uVar6;
          }
          else {
            if (uVar6 != (uint)local_58) {
              return (roaring_bitmap_t *)ra;
            }
            bVar1 = sa->flags;
            end_index = (uint)local_78;
          }
          ra_append_copy_range(ra,sa,uVar12,end_index,(_Bool)(bVar1 & 1));
          return (roaring_bitmap_t *)ra;
        }
        local_9a = sa->keys[uVar12 & 0xffff];
        uVar15 = local_70->keys[(uint)uVar16 & 0xffff];
        local_90 = (ulong)uVar12;
      } while( true );
    }
  }
  prVar7 = roaring_bitmap_copy(prVar7);
  return prVar7;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_lazy_or(const roaring_bitmap_t *x1,
                                         const roaring_bitmap_t *x2,
                                         const bool bitsetconversion) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c;
            if (bitsetconversion &&
                (get_container_type(c1, type1) != BITSET_CONTAINER_TYPE) &&
                (get_container_type(c2, type2) != BITSET_CONTAINER_TYPE)
            ){
                container_t *newc1 =
                    container_mutable_unwrap_shared(c1, &type1);
                newc1 = container_to_bitset(newc1, type1);
                type1 = BITSET_CONTAINER_TYPE;
                c = container_lazy_ior(newc1, type1, c2, type2,
                                       &result_type);
                if (c != newc1) {  // should not happen
                    container_free(newc1, type1);
                }
            } else {
                c = container_lazy_or(c1, type1, c2, type2, &result_type);
            }
            // since we assume that the initial containers are non-empty,
            // the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}